

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O3

int luaE_resetthread(lua_State *L,int status)

{
  int iVar1;
  long lVar2;
  StkId oldtop;
  
  L->ci = &L->base_ci;
  *(undefined1 *)((L->stack).offset + 8) = 0;
  (L->base_ci).func = L->stack;
  (L->base_ci).callstatus = 2;
  iVar1 = 0;
  if (status != 1) {
    iVar1 = status;
  }
  L->status = '\0';
  iVar1 = luaD_closeprotected(L,1,iVar1);
  lVar2 = (L->stack).offset;
  oldtop = (StkId)(lVar2 + 0x10);
  if (iVar1 == 0) {
    (L->top).p = oldtop;
  }
  else {
    luaD_seterrorobj(L,iVar1,oldtop);
    oldtop = (StkId)(L->top).offset;
    lVar2 = (L->stack).offset;
  }
  (L->base_ci).top.p = oldtop + 0x14;
  luaD_reallocstack(L,(int)((ulong)((long)(oldtop + 0x14) - lVar2) >> 4),0);
  return iVar1;
}

Assistant:

int luaE_resetthread (lua_State *L, int status) {
  CallInfo *ci = L->ci = &L->base_ci;  /* unwind CallInfo list */
  setnilvalue(s2v(L->stack.p));  /* 'function' entry for basic 'ci' */
  ci->func.p = L->stack.p;
  ci->callstatus = CIST_C;
  if (status == LUA_YIELD)
    status = LUA_OK;
  L->status = LUA_OK;  /* so it can run __close metamethods */
  status = luaD_closeprotected(L, 1, status);
  if (status != LUA_OK)  /* errors? */
    luaD_seterrorobj(L, status, L->stack.p + 1);
  else
    L->top.p = L->stack.p + 1;
  ci->top.p = L->top.p + LUA_MINSTACK;
  luaD_reallocstack(L, cast_int(ci->top.p - L->stack.p), 0);
  return status;
}